

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

ExpressionResult * __thiscall
iutest::detail::ExpressionResult::operator&&
          (ExpressionResult *__return_storage_ptr__,ExpressionResult *this,bool *rhs)

{
  bool bVar1;
  AssertionResult *pAVar2;
  byte local_65;
  char *local_58;
  AssertionResult local_50;
  undefined1 local_21;
  bool *pbStack_20;
  bool b;
  bool *rhs_local;
  ExpressionResult *this_local;
  
  pbStack_20 = rhs;
  rhs_local = (bool *)this;
  this_local = __return_storage_ptr__;
  bVar1 = result(this);
  local_65 = 0;
  if (bVar1) {
    local_65 = *pbStack_20;
  }
  local_21 = local_65 & 1;
  AssertionResult::AssertionResult(&local_50,(bool)local_21);
  local_58 = AssertionResult::message(&this->m_result);
  pAVar2 = AssertionResult::operator<<(&local_50,&local_58);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" && ");
  pAVar2 = AssertionResult::operator<<(pAVar2,pbStack_20);
  ExpressionResult(__return_storage_ptr__,pAVar2);
  AssertionResult::~AssertionResult(&local_50);
  return __return_storage_ptr__;
}

Assistant:

IIUT_DECL_EXPRESSION_RESULT_OP(||)
    IIUT_DECL_EXPRESSION_RESULT_OP(&&)

public:
    AssertionResult GetResult(bool expected) const
    {
        return AssertionResult(result() == expected) << "expansion: " << m_result.message();
    }